

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

int __thiscall Samba::init(Samba *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  pointer pSVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  size_t extIndex;
  SambaError *err;
  string local_468;
  string local_448 [8];
  string ver;
  uint8_t dummy [1024];
  undefined1 local_1b;
  undefined1 local_1a;
  Samba *pSStack_18;
  uint8_t cmd [3];
  Samba *this_local;
  
  pSStack_18 = this;
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar2->_vptr_SerialPort[9])(pSVar2,100);
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar2->_vptr_SerialPort[5])(pSVar2,(undefined1 *)((long)&ver.field_2 + 8),0x400);
  if ((this->_isUsb & 1U) == 0) {
    if ((this->_debug & 1U) != 0) {
      printf("Send auto-baud\n");
    }
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[8])(pSVar2,0x80);
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[7])();
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[8])(pSVar2,0x80);
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[7])();
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[8])(pSVar2,0x23);
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[5])(pSVar2,&local_1b,3);
  }
  if ((this->_debug & 1U) != 0) {
    printf("Set binary mode\n");
  }
  local_1b = 0x4e;
  local_1a = 0x23;
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar2->_vptr_SerialPort[6])();
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar2->_vptr_SerialPort[5])(pSVar2,&local_1b,2);
  std::__cxx11::string::string(local_448);
  version_abi_cxx11_(&local_468,this);
  std::__cxx11::string::operator=(local_448,(string *)&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  lVar3 = std::__cxx11::string::find((char *)local_448,0x11f1b4);
  if (lVar3 != -1) {
    while (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_448), *pcVar4 != ']') {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_448);
      cVar1 = *pcVar4;
      if (cVar1 == 'X') {
        this->_canChipErase = true;
      }
      else if (cVar1 == 'Y') {
        this->_canWriteBuffer = true;
      }
      else if (cVar1 == 'Z') {
        this->_canChecksumBuffer = true;
      }
    }
    if ((this->_isUsb & 1U) != 0) {
      this->_readBufferSize = 0x3f;
    }
  }
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar2->_vptr_SerialPort[9])(pSVar2,1000);
  uVar5 = std::__cxx11::string::~string(local_448);
  return (int)CONCAT71((int7)((ulong)uVar5 >> 8),1);
}

Assistant:

bool
Samba::init()
{
    
    uint8_t cmd[3];
    _port->timeout(TIMEOUT_QUICK);

    // Flush garbage
    uint8_t dummy[1024];
    _port->read(dummy, sizeof(dummy));

    if (!_isUsb)
    {
        if (_debug)
            printf("Send auto-baud\n");

        // RS-232 auto-baud sequence
        _port->put(0x80);
        _port->get();
        _port->put(0x80);
        _port->get();
        _port->put('#');
        _port->read(cmd, 3);
    }

    // Set binary mode
    if (_debug)
        printf("Set binary mode\n");

    cmd[0] = 'N';
    cmd[1] = '#';
    _port->write(cmd, 2);
    
    _port->read(cmd, 2);


    std::string ver;
    try
    {
        ver = version();
    }
    catch(SambaError& err)
    {
        return false;
    }

    std::size_t extIndex = ver.find("[Arduino:");
    
     
    if (extIndex != string::npos)
    {
        extIndex += 9;
        while (ver[extIndex] != ']')
        {
            switch (ver[extIndex])
            {
                case 'X': _canChipErase = true; break;
                case 'Y': _canWriteBuffer = true; break;
                case 'Z': _canChecksumBuffer = true; break;
            }
            extIndex++;
        }

        // All SAMD-based Arduino/AdaFruit boards have a bug in their bootloader
        // that trying to read 64 bytes or more over USB corrupts the data.
        // We must limit these boards to read chunks of 63 bytes.
        if (_isUsb)
            _readBufferSize = 63;
    }

    _port->timeout(TIMEOUT_NORMAL);

    return true;
}